

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMLCPSolver.cpp
# Opt level: O0

void __thiscall btMLCPSolver::createMLCPFast(btMLCPSolver *this,btContactSolverInfo *infoGlobal)

{
  btRigidBody *pbVar1;
  btSolverConstraint *pbVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  btSolverConstraint **ppbVar8;
  float *pfVar9;
  int *piVar10;
  btSolverBody *pbVar11;
  btConstraintInfo1 *pbVar12;
  btJointNode *pbVar13;
  long in_RSI;
  long in_RDI;
  float fVar14;
  btVector3 bVar15;
  btSolverConstraint *c_2;
  int i_5;
  CProfileSample __profile_13;
  CProfileSample __profile_12;
  int i_4;
  btScalar *Jrow;
  btScalar *JinvMrow_1;
  uint infom;
  btRigidBody *orgBodyB_1;
  int sbB_2;
  int jj;
  int numJointRows;
  int row___1;
  CProfileSample __profile_11;
  size_t ofsother_1;
  int numRowsOther_1;
  int cj1;
  int j1;
  int startJointNodeB;
  size_t ofsother;
  int numRowsOther;
  int cr0;
  int j0;
  int startJointNodeA;
  btScalar *JinvMrow;
  int sbB_1;
  int sbA_1;
  int row__;
  int i_3;
  CProfileSample __profile_10;
  int numRows_1;
  int c;
  CProfileSample __profile_9;
  CProfileSample __profile_8;
  btScalar *Jptr;
  btScalar *JinvM;
  int r_1;
  btVector3 relPosInvInertiaB;
  btVector3 normalInvMassB;
  int row_1;
  int prevSlot_1;
  int slotB;
  int r;
  btVector3 relPosCrossNormalInvInertia;
  btVector3 normalInvMass;
  int row;
  int prevSlot;
  int slotA;
  btRigidBody *orgBodyB;
  btRigidBody *orgBodyA;
  int sbB;
  int sbA;
  int i_2;
  int numRows;
  int c_1;
  CProfileSample __profile_7;
  CProfileSample __profile_6;
  int rowOffset;
  int cur;
  CProfileSample __profile_5;
  CProfileSample __profile_4;
  CProfileSample __profile_3;
  btAlignedObjectArray<btJointNode> jointNodeArray;
  CProfileSample __profile_2;
  btAlignedObjectArray<int> bodyJointNodeArray;
  int numBodies;
  int m;
  int i_1;
  CProfileSample __profile_1;
  btScalar rhsPenetration;
  btScalar rhs;
  btScalar jacDiag;
  int i;
  CProfileSample __profile;
  int n;
  int numConstraintRows;
  int numContactRows;
  int in_stack_fffffffffffff8c8;
  int in_stack_fffffffffffff8cc;
  undefined4 in_stack_fffffffffffff8d0;
  btScalar in_stack_fffffffffffff8d4;
  btJointNode *in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e4;
  btScalar bVar16;
  undefined8 in_stack_fffffffffffff8e8;
  btMatrixX<float> *in_stack_fffffffffffff8f0;
  int in_stack_fffffffffffff8f8;
  int in_stack_fffffffffffff8fc;
  btScalar *in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff90c;
  btMatrixX<float> *in_stack_fffffffffffff910;
  int in_stack_fffffffffffff920;
  int local_6dc;
  int local_59c;
  btScalar local_4f8;
  btScalar bStack_4f4;
  btScalar local_4b8;
  btScalar bStack_4b4;
  int local_468;
  btScalar local_3c8;
  btScalar bStack_3c4;
  btScalar local_388;
  btScalar bStack_384;
  int local_348;
  int local_2fc;
  int local_224;
  int local_21c;
  int local_1f0;
  int local_1e8;
  int local_1cc;
  int local_1b4;
  int local_19c;
  int local_190;
  int local_178;
  btVector3 local_174;
  btScalar local_164;
  btVector3 local_160;
  int local_150;
  int local_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  int local_12c;
  int local_128;
  btVector3 local_124;
  btScalar local_114;
  btVector3 local_110;
  int local_100;
  int local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  int local_dc;
  btRigidBody *local_d8;
  btRigidBody *local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  undefined4 local_ac;
  int local_a4;
  int local_a0;
  btAlignedObjectArray<btJointNode> local_98;
  undefined4 local_78;
  btAlignedObjectArray<int> local_70;
  int local_4c;
  int local_48;
  int local_44;
  float local_3c;
  float local_38;
  btScalar local_34;
  int local_30;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  
  local_14 = (interleaveContactAndFriction & 1) * 2 + 1;
  local_10 = in_RSI;
  local_1c = btAlignedObjectArray<btSolverConstraint_*>::size
                       ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0));
  local_18 = local_1c;
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  btVectorX<float>::resize
            ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             in_stack_fffffffffffff8cc);
  btVectorX<float>::resize
            ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             in_stack_fffffffffffff8cc);
  btVectorX<float>::setZero
            ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
  btVectorX<float>::setZero
            ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
  for (local_30 = 0; local_30 < local_18; local_30 = local_30 + 1) {
    ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_30);
    local_34 = (*ppbVar8)->m_jacDiagABInv;
    bVar3 = btFuzzyZero(0.0);
    if (!bVar3) {
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_30);
      local_38 = (*ppbVar8)->m_rhs;
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_30);
      local_3c = (*ppbVar8)->m_rhsPenetration;
      fVar14 = local_38 / local_34;
      pfVar9 = btVectorX<float>::operator[]
                         ((btVectorX<float> *)
                          CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                          in_stack_fffffffffffff8cc);
      *pfVar9 = fVar14;
      fVar14 = local_3c / local_34;
      pfVar9 = btVectorX<float>::operator[]
                         ((btVectorX<float> *)
                          CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                          in_stack_fffffffffffff8cc);
      *pfVar9 = fVar14;
    }
  }
  CProfileSample::~CProfileSample((CProfileSample *)0x25f83c);
  btVectorX<float>::resize
            ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             in_stack_fffffffffffff8cc);
  btVectorX<float>::resize
            ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             in_stack_fffffffffffff8cc);
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  for (local_44 = 0; local_44 < local_18; local_44 = local_44 + 1) {
    ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_44);
    bVar16 = (*ppbVar8)->m_lowerLimit;
    pfVar9 = btVectorX<float>::operator[]
                       ((btVectorX<float> *)
                        CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                        in_stack_fffffffffffff8cc);
    *pfVar9 = bVar16;
    ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_44);
    bVar16 = (*ppbVar8)->m_upperLimit;
    pfVar9 = btVectorX<float>::operator[]
                       ((btVectorX<float> *)
                        CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                        in_stack_fffffffffffff8cc);
    *pfVar9 = bVar16;
  }
  CProfileSample::~CProfileSample((CProfileSample *)0x25f9de);
  local_48 = btAlignedObjectArray<btSolverConstraint_*>::size
                       ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0));
  local_4c = btAlignedObjectArray<btSolverBody>::size
                       ((btAlignedObjectArray<btSolverBody> *)(in_RDI + 8));
  btAlignedObjectArray<int>::btAlignedObjectArray
            ((btAlignedObjectArray<int> *)
             CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  local_78 = 0xffffffff;
  btAlignedObjectArray<int>::resize
            ((btAlignedObjectArray<int> *)in_stack_fffffffffffff8f0,
             (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
             (int *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
  CProfileSample::~CProfileSample((CProfileSample *)0x25fa6a);
  btAlignedObjectArray<btJointNode>::btAlignedObjectArray
            ((btAlignedObjectArray<btJointNode> *)
             CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  btAlignedObjectArray<btSolverConstraint_*>::size
            ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0));
  btAlignedObjectArray<btJointNode>::reserve
            ((btAlignedObjectArray<btJointNode> *)
             CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
             (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
  CProfileSample::~CProfileSample((CProfileSample *)0x25fad1);
  if ((createMLCPFast(btContactSolverInfo_const&)::J3 == '\0') &&
     (iVar4 = __cxa_guard_acquire(&createMLCPFast(btContactSolverInfo_const&)::J3), iVar4 != 0)) {
    btMatrixX<float>::btMatrixX
              ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    __cxa_atexit(btMatrixX<float>::~btMatrixX,&createMLCPFast::J3,&__dso_handle);
    __cxa_guard_release(&createMLCPFast(btContactSolverInfo_const&)::J3);
  }
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  btMatrixX<float>::resize
            (in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
             (int)in_stack_fffffffffffff8e8);
  CProfileSample::~CProfileSample((CProfileSample *)0x25fb5e);
  if ((createMLCPFast(btContactSolverInfo_const&)::JinvM3 == '\0') &&
     (iVar4 = __cxa_guard_acquire(&createMLCPFast(btContactSolverInfo_const&)::JinvM3), iVar4 != 0))
  {
    btMatrixX<float>::btMatrixX
              ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    __cxa_atexit(btMatrixX<float>::~btMatrixX,&createMLCPFast::JinvM3,&__dso_handle);
    __cxa_guard_release(&createMLCPFast(btContactSolverInfo_const&)::JinvM3);
  }
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  btMatrixX<float>::resize
            (in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
             (int)in_stack_fffffffffffff8e8);
  btMatrixX<float>::setZero
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
  btMatrixX<float>::setZero
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
  CProfileSample::~CProfileSample((CProfileSample *)0x25fc07);
  local_a0 = 0;
  local_a4 = 0;
  if ((createMLCPFast(btContactSolverInfo_const&)::ofs == '\0') &&
     (iVar4 = __cxa_guard_acquire(&createMLCPFast(btContactSolverInfo_const&)::ofs), iVar4 != 0)) {
    btAlignedObjectArray<int>::btAlignedObjectArray
              ((btAlignedObjectArray<int> *)
               CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    __cxa_atexit(btAlignedObjectArray<int>::~btAlignedObjectArray,&createMLCPFast::ofs,&__dso_handle
                );
    __cxa_guard_release(&createMLCPFast(btContactSolverInfo_const&)::ofs);
  }
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  local_ac = 0;
  btAlignedObjectArray<int>::resize
            ((btAlignedObjectArray<int> *)in_stack_fffffffffffff8f0,
             (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
             (int *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
  btAlignedObjectArray<btSolverConstraint_*>::size
            ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0));
  btAlignedObjectArray<int>::resizeNoInitialize
            ((btAlignedObjectArray<int> *)
             CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),in_stack_fffffffffffff8cc
            );
  CProfileSample::~CProfileSample((CProfileSample *)0x25fce3);
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  local_b4 = 0;
  local_b8 = 0;
  for (local_bc = 0; iVar4 = local_bc,
      iVar5 = btAlignedObjectArray<btSolverConstraint_*>::size
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0)),
      iVar6 = local_a4, iVar4 < iVar5; local_bc = local_b8 + local_bc) {
    piVar10 = btAlignedObjectArray<int>::operator[](&createMLCPFast::ofs,local_b4);
    *piVar10 = iVar6;
    ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_bc);
    local_c0 = (*ppbVar8)->m_solverBodyIdA;
    ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_bc);
    local_c4 = (*ppbVar8)->m_solverBodyIdB;
    pbVar11 = btAlignedObjectArray<btSolverBody>::operator[]
                        ((btAlignedObjectArray<btSolverBody> *)(in_RDI + 8),local_c0);
    local_d0 = pbVar11->m_originalBody;
    pbVar11 = btAlignedObjectArray<btSolverBody>::operator[]
                        ((btAlignedObjectArray<btSolverBody> *)(in_RDI + 8),local_c4);
    iVar4 = local_bc;
    local_d8 = pbVar11->m_originalBody;
    iVar6 = btAlignedObjectArray<btSolverConstraint>::size
                      ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 0x48));
    if (iVar4 < iVar6) {
      pbVar12 = btAlignedObjectArray<btTypedConstraint::btConstraintInfo1>::operator[]
                          ((btAlignedObjectArray<btTypedConstraint::btConstraintInfo1> *)
                           (in_RDI + 0x108),local_b4);
      local_2fc = pbVar12->m_numConstraintRows;
    }
    else {
      local_2fc = local_14;
    }
    local_b8 = local_2fc;
    if (local_d0 == (btRigidBody *)0x0) {
      local_a0 = local_2fc + local_a0;
    }
    else {
      local_dc = 0xffffffff;
      local_dc = btAlignedObjectArray<btJointNode>::size(&local_98);
      local_f8 = 0;
      uStack_f0 = 0;
      btAlignedObjectArray<btJointNode>::expand
                ((btAlignedObjectArray<btJointNode> *)
                 CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                 in_stack_fffffffffffff8d8);
      piVar10 = btAlignedObjectArray<int>::operator[](&local_70,local_c0);
      iVar6 = local_dc;
      local_fc = *piVar10;
      piVar10 = btAlignedObjectArray<int>::operator[](&local_70,local_c0);
      iVar4 = local_fc;
      *piVar10 = iVar6;
      pbVar13 = btAlignedObjectArray<btJointNode>::operator[](&local_98,local_dc);
      iVar6 = local_b4;
      pbVar13->nextJointNodeIndex = iVar4;
      pbVar13 = btAlignedObjectArray<btJointNode>::operator[](&local_98,local_dc);
      iVar4 = local_bc;
      pbVar13->jointIndex = iVar6;
      pbVar13 = btAlignedObjectArray<btJointNode>::operator[](&local_98,local_dc);
      pbVar13->constraintRowIndex = iVar4;
      if (local_d8 == (btRigidBody *)0x0) {
        local_348 = -1;
      }
      else {
        local_348 = local_c4;
      }
      pbVar13 = btAlignedObjectArray<btJointNode>::operator[](&local_98,local_dc);
      pbVar13->otherBodyIndex = local_348;
      for (local_100 = 0; local_100 < local_b8; local_100 = local_100 + 1) {
        btAlignedObjectArray<btSolverConstraint_*>::operator[]
                  ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),
                   local_bc + local_100);
        local_114 = btRigidBody::getInvMass(local_d0);
        bVar15 = ::operator*((btVector3 *)
                             CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                             (btScalar *)in_stack_fffffffffffff8d8);
        local_110.m_floats._8_8_ = bVar15.m_floats._8_8_;
        local_388 = bVar15.m_floats[0];
        bStack_384 = bVar15.m_floats[1];
        local_110.m_floats[0] = local_388;
        local_110.m_floats[1] = bStack_384;
        btAlignedObjectArray<btSolverConstraint_*>::operator[]
                  ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),
                   local_bc + local_100);
        btRigidBody::getInvInertiaTensorWorld(local_d0);
        bVar15 = ::operator*((btVector3 *)
                             CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                             (btMatrix3x3 *)in_stack_fffffffffffff8d8);
        local_124.m_floats._8_8_ = bVar15.m_floats._8_8_;
        local_3c8 = bVar15.m_floats[0];
        bStack_3c4 = bVar15.m_floats[1];
        local_124.m_floats[0] = local_3c8;
        local_124.m_floats[1] = bStack_3c4;
        for (local_128 = 0; local_128 < 3; local_128 = local_128 + 1) {
          ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                              ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),
                               local_bc + local_100);
          btVector3::operator_cast_to_float_(&(*ppbVar8)->m_contactNormal1);
          btMatrixX<float>::setElem
                    ((btMatrixX<float> *)
                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
          ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                              ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),
                               local_bc + local_100);
          btVector3::operator_cast_to_float_(&(*ppbVar8)->m_relpos1CrossNormal);
          btMatrixX<float>::setElem
                    ((btMatrixX<float> *)
                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
          btVector3::operator_cast_to_float_(&local_110);
          btMatrixX<float>::setElem
                    ((btMatrixX<float> *)
                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
          btVector3::operator_cast_to_float_(&local_124);
          btMatrixX<float>::setElem
                    ((btMatrixX<float> *)
                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
        }
        btMatrixX<float>::setElem
                  ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
                   ,in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
        btMatrixX<float>::setElem
                  ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
                   ,in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
        btMatrixX<float>::setElem
                  ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
                   ,in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
        btMatrixX<float>::setElem
                  ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
                   ,in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
        local_a0 = local_a0 + 1;
      }
    }
    if (local_d8 == (btRigidBody *)0x0) {
      local_a0 = local_b8 + local_a0;
    }
    else {
      local_12c = 0xffffffff;
      local_12c = btAlignedObjectArray<btJointNode>::size(&local_98);
      local_148 = 0;
      uStack_140 = 0;
      btAlignedObjectArray<btJointNode>::expand
                ((btAlignedObjectArray<btJointNode> *)
                 CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                 in_stack_fffffffffffff8d8);
      piVar10 = btAlignedObjectArray<int>::operator[](&local_70,local_c4);
      iVar6 = local_12c;
      local_14c = *piVar10;
      piVar10 = btAlignedObjectArray<int>::operator[](&local_70,local_c4);
      iVar4 = local_14c;
      *piVar10 = iVar6;
      pbVar13 = btAlignedObjectArray<btJointNode>::operator[](&local_98,local_12c);
      iVar6 = local_b4;
      pbVar13->nextJointNodeIndex = iVar4;
      pbVar13 = btAlignedObjectArray<btJointNode>::operator[](&local_98,local_12c);
      pbVar13->jointIndex = iVar6;
      if (local_d0 == (btRigidBody *)0x0) {
        local_468 = -1;
      }
      else {
        local_468 = local_c0;
      }
      pbVar13 = btAlignedObjectArray<btJointNode>::operator[](&local_98,local_12c);
      iVar4 = local_bc;
      pbVar13->otherBodyIndex = local_468;
      pbVar13 = btAlignedObjectArray<btJointNode>::operator[](&local_98,local_12c);
      pbVar13->constraintRowIndex = iVar4;
      for (local_150 = 0; local_150 < local_b8; local_150 = local_150 + 1) {
        btAlignedObjectArray<btSolverConstraint_*>::operator[]
                  ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),
                   local_bc + local_150);
        local_164 = btRigidBody::getInvMass(local_d8);
        bVar15 = ::operator*((btVector3 *)
                             CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                             (btScalar *)in_stack_fffffffffffff8d8);
        local_160.m_floats._8_8_ = bVar15.m_floats._8_8_;
        local_4b8 = bVar15.m_floats[0];
        bStack_4b4 = bVar15.m_floats[1];
        local_160.m_floats[0] = local_4b8;
        local_160.m_floats[1] = bStack_4b4;
        btAlignedObjectArray<btSolverConstraint_*>::operator[]
                  ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),
                   local_bc + local_150);
        btRigidBody::getInvInertiaTensorWorld(local_d8);
        bVar15 = ::operator*((btVector3 *)
                             CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                             (btMatrix3x3 *)in_stack_fffffffffffff8d8);
        local_174.m_floats._8_8_ = bVar15.m_floats._8_8_;
        local_4f8 = bVar15.m_floats[0];
        bStack_4f4 = bVar15.m_floats[1];
        local_174.m_floats[0] = local_4f8;
        local_174.m_floats[1] = bStack_4f4;
        for (local_178 = 0; local_178 < 3; local_178 = local_178 + 1) {
          ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                              ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),
                               local_bc + local_150);
          btVector3::operator_cast_to_float_(&(*ppbVar8)->m_contactNormal2);
          btMatrixX<float>::setElem
                    ((btMatrixX<float> *)
                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
          ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                              ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),
                               local_bc + local_150);
          btVector3::operator_cast_to_float_(&(*ppbVar8)->m_relpos2CrossNormal);
          btMatrixX<float>::setElem
                    ((btMatrixX<float> *)
                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
          btVector3::operator_cast_to_float_(&local_160);
          btMatrixX<float>::setElem
                    ((btMatrixX<float> *)
                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
          btVector3::operator_cast_to_float_(&local_174);
          btMatrixX<float>::setElem
                    ((btMatrixX<float> *)
                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
        }
        btMatrixX<float>::setElem
                  ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
                   ,in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
        btMatrixX<float>::setElem
                  ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
                   ,in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
        btMatrixX<float>::setElem
                  ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
                   ,in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
        btMatrixX<float>::setElem
                  ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
                   ,in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
        local_a0 = local_a0 + 1;
      }
    }
    local_a4 = local_b8 + local_a4;
    local_b4 = local_b4 + 1;
  }
  CProfileSample::~CProfileSample((CProfileSample *)0x260d75);
  btMatrixX<float>::getBufferPointer
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
  btMatrixX<float>::getBufferPointer
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  btMatrixX<float>::resize
            (in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
             (int)in_stack_fffffffffffff8e8);
  CProfileSample::~CProfileSample((CProfileSample *)0x260e03);
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  btMatrixX<float>::setZero
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
  CProfileSample::~CProfileSample((CProfileSample *)0x260e3c);
  local_190 = 0;
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  for (local_19c = 0;
      iVar4 = btAlignedObjectArray<btSolverConstraint_*>::size
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0)),
      local_19c < iVar4; local_19c = local_59c + local_19c) {
    btAlignedObjectArray<int>::operator[](&createMLCPFast::ofs,local_190);
    ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_19c);
    iVar4 = (*ppbVar8)->m_solverBodyIdA;
    ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_19c);
    iVar6 = (*ppbVar8)->m_solverBodyIdB;
    iVar5 = btAlignedObjectArray<btSolverConstraint>::size
                      ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 0x48));
    if (local_19c < iVar5) {
      pbVar12 = btAlignedObjectArray<btTypedConstraint::btConstraintInfo1>::operator[]
                          ((btAlignedObjectArray<btTypedConstraint::btConstraintInfo1> *)
                           (in_RDI + 0x108),local_190);
      local_59c = pbVar12->m_numConstraintRows;
    }
    else {
      local_59c = local_14;
    }
    piVar10 = btAlignedObjectArray<int>::operator[](&local_70,iVar4);
    local_1b4 = *piVar10;
    while (-1 < local_1b4) {
      pbVar13 = btAlignedObjectArray<btJointNode>::operator[](&local_98,local_1b4);
      iVar4 = pbVar13->jointIndex;
      pbVar13 = btAlignedObjectArray<btJointNode>::operator[](&local_98,local_1b4);
      iVar5 = pbVar13->constraintRowIndex;
      if (iVar4 < local_190) {
        iVar7 = btAlignedObjectArray<btSolverConstraint>::size
                          ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 0x48));
        if (iVar5 < iVar7) {
          btAlignedObjectArray<btTypedConstraint::btConstraintInfo1>::operator[]
                    ((btAlignedObjectArray<btTypedConstraint::btConstraintInfo1> *)(in_RDI + 0x108),
                     iVar4);
        }
        btAlignedObjectArray<btSolverConstraint_*>::operator[]
                  ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),iVar5);
        btAlignedObjectArray<int>::operator[](&createMLCPFast::ofs,iVar4);
        piVar10 = btAlignedObjectArray<int>::operator[](&createMLCPFast::ofs,iVar4);
        in_stack_fffffffffffff8c8 = *piVar10;
        btMatrixX<float>::multiplyAdd2_p8r
                  (in_stack_fffffffffffff910,
                   (btScalar *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                   in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8,
                   (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),in_stack_fffffffffffff920);
      }
      pbVar13 = btAlignedObjectArray<btJointNode>::operator[](&local_98,local_1b4);
      local_1b4 = pbVar13->nextJointNodeIndex;
    }
    piVar10 = btAlignedObjectArray<int>::operator[](&local_70,iVar6);
    local_1cc = *piVar10;
    while (-1 < local_1cc) {
      pbVar13 = btAlignedObjectArray<btJointNode>::operator[](&local_98,local_1cc);
      iVar4 = pbVar13->jointIndex;
      pbVar13 = btAlignedObjectArray<btJointNode>::operator[](&local_98,local_1cc);
      iVar6 = pbVar13->constraintRowIndex;
      if (iVar4 < local_190) {
        iVar5 = btAlignedObjectArray<btSolverConstraint>::size
                          ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 0x48));
        if (iVar6 < iVar5) {
          btAlignedObjectArray<btTypedConstraint::btConstraintInfo1>::operator[]
                    ((btAlignedObjectArray<btTypedConstraint::btConstraintInfo1> *)(in_RDI + 0x108),
                     iVar4);
        }
        btAlignedObjectArray<btSolverConstraint_*>::operator[]
                  ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),iVar6);
        btAlignedObjectArray<int>::operator[](&createMLCPFast::ofs,iVar4);
        piVar10 = btAlignedObjectArray<int>::operator[](&createMLCPFast::ofs,iVar4);
        in_stack_fffffffffffff8c8 = *piVar10;
        btMatrixX<float>::multiplyAdd2_p8r
                  (in_stack_fffffffffffff910,
                   (btScalar *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                   in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8,
                   (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),in_stack_fffffffffffff920);
      }
      pbVar13 = btAlignedObjectArray<btJointNode>::operator[](&local_98,local_1cc);
      local_1cc = pbVar13->nextJointNodeIndex;
    }
    local_190 = local_190 + 1;
  }
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  local_1e8 = 0;
  iVar4 = btAlignedObjectArray<btSolverConstraint_*>::size
                    ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0));
  local_1f0 = 0;
  for (; local_1e8 < iVar4; local_1e8 = local_6dc + local_1e8) {
    ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_1e8);
    pbVar11 = btAlignedObjectArray<btSolverBody>::operator[]
                        ((btAlignedObjectArray<btSolverBody> *)(in_RDI + 8),
                         (*ppbVar8)->m_solverBodyIdB);
    pbVar1 = pbVar11->m_originalBody;
    iVar6 = btAlignedObjectArray<btSolverConstraint>::size
                      ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 0x48));
    if (local_1e8 < iVar6) {
      pbVar12 = btAlignedObjectArray<btTypedConstraint::btConstraintInfo1>::operator[]
                          ((btAlignedObjectArray<btTypedConstraint::btConstraintInfo1> *)
                           (in_RDI + 0x108),local_1f0);
      local_6dc = pbVar12->m_numConstraintRows;
    }
    else {
      local_6dc = local_14;
    }
    in_stack_fffffffffffff8c8 = local_1e8;
    btMatrixX<float>::multiply2_p8r
              (in_stack_fffffffffffff910,
               (btScalar *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
               in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8,
               (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),in_stack_fffffffffffff920);
    if (pbVar1 != (btRigidBody *)0x0) {
      in_stack_fffffffffffff8c8 = local_1e8;
      btMatrixX<float>::multiplyAdd2_p8r
                (in_stack_fffffffffffff910,
                 (btScalar *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                 in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8,
                 (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),in_stack_fffffffffffff920);
    }
    local_1f0 = local_1f0 + 1;
  }
  CProfileSample::~CProfileSample((CProfileSample *)0x26190b);
  CProfileSample::~CProfileSample((CProfileSample *)0x261918);
  for (local_21c = 0; iVar4 = btMatrixX<float>::rows((btMatrixX<float> *)(in_RDI + 0x148)),
      local_21c < iVar4; local_21c = local_21c + 1) {
    btMatrixX<float>::operator()
              ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
               in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8);
    btMatrixX<float>::setElem
              ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
               in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,0.0);
  }
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  btMatrixX<float>::copyLowerToUpperTriangle(in_stack_fffffffffffff8f0);
  CProfileSample::~CProfileSample((CProfileSample *)0x261a30);
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  btVectorX<float>::resize
            ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             in_stack_fffffffffffff8cc);
  btVectorX<float>::resize
            ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             in_stack_fffffffffffff8cc);
  if ((*(uint *)(local_10 + 0x40) & 4) == 0) {
    btVectorX<float>::setZero
              ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    btVectorX<float>::setZero
              ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
  }
  else {
    local_224 = 0;
    while (iVar4 = local_224,
          iVar6 = btAlignedObjectArray<btSolverConstraint_*>::size
                            ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0)),
          iVar4 < iVar6) {
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_224)
      ;
      pbVar2 = *ppbVar8;
      bVar16 = pbVar2->m_appliedImpulse;
      pfVar9 = btVectorX<float>::operator[]
                         ((btVectorX<float> *)
                          CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                          in_stack_fffffffffffff8cc);
      *pfVar9 = bVar16;
      in_stack_fffffffffffff8d4 = pbVar2->m_appliedPushImpulse;
      pfVar9 = btVectorX<float>::operator[]
                         ((btVectorX<float> *)
                          CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                          in_stack_fffffffffffff8cc);
      *pfVar9 = in_stack_fffffffffffff8d4;
      local_224 = local_224 + 1;
    }
  }
  CProfileSample::~CProfileSample((CProfileSample *)0x261c2d);
  btAlignedObjectArray<btJointNode>::~btAlignedObjectArray
            ((btAlignedObjectArray<btJointNode> *)0x261c3a);
  btAlignedObjectArray<int>::~btAlignedObjectArray((btAlignedObjectArray<int> *)0x261c47);
  return;
}

Assistant:

void btMLCPSolver::createMLCPFast(const btContactSolverInfo& infoGlobal)
{
	int numContactRows = interleaveContactAndFriction ? 3 : 1;

	int numConstraintRows = m_allConstraintPtrArray.size();
	int n = numConstraintRows;
	{
		BT_PROFILE("init b (rhs)");
		m_b.resize(numConstraintRows);
		m_bSplit.resize(numConstraintRows);
		m_b.setZero();
		m_bSplit.setZero();
		for (int i=0;i<numConstraintRows ;i++)
		{
			btScalar jacDiag = m_allConstraintPtrArray[i]->m_jacDiagABInv;
			if (!btFuzzyZero(jacDiag))
			{
				btScalar rhs = m_allConstraintPtrArray[i]->m_rhs;
				btScalar rhsPenetration = m_allConstraintPtrArray[i]->m_rhsPenetration;
				m_b[i]=rhs/jacDiag;
				m_bSplit[i] = rhsPenetration/jacDiag;
			}

		}
	}

//	btScalar* w = 0;
//	int nub = 0;

	m_lo.resize(numConstraintRows);
	m_hi.resize(numConstraintRows);
 
	{
		BT_PROFILE("init lo/ho");

		for (int i=0;i<numConstraintRows;i++)
		{
			if (0)//m_limitDependencies[i]>=0)
			{
				m_lo[i] = -BT_INFINITY;
				m_hi[i] = BT_INFINITY;
			} else
			{
				m_lo[i] = m_allConstraintPtrArray[i]->m_lowerLimit;
				m_hi[i] = m_allConstraintPtrArray[i]->m_upperLimit;
			}
		}
	}

	//
	int m=m_allConstraintPtrArray.size();

	int numBodies = m_tmpSolverBodyPool.size();
	btAlignedObjectArray<int> bodyJointNodeArray;
	{
		BT_PROFILE("bodyJointNodeArray.resize");
		bodyJointNodeArray.resize(numBodies,-1);
	}
	btAlignedObjectArray<btJointNode> jointNodeArray;
	{
		BT_PROFILE("jointNodeArray.reserve");
		jointNodeArray.reserve(2*m_allConstraintPtrArray.size());
	}

	static btMatrixXu J3;
	{
		BT_PROFILE("J3.resize");
		J3.resize(2*m,8);
	}
	static btMatrixXu JinvM3;
	{
		BT_PROFILE("JinvM3.resize/setZero");

		JinvM3.resize(2*m,8);
		JinvM3.setZero();
		J3.setZero();
	}
	int cur=0;
	int rowOffset = 0;
	static btAlignedObjectArray<int> ofs;
	{
		BT_PROFILE("ofs resize");
		ofs.resize(0);
		ofs.resizeNoInitialize(m_allConstraintPtrArray.size());
	}				
	{
		BT_PROFILE("Compute J and JinvM");
		int c=0;

		int numRows = 0;

		for (int i=0;i<m_allConstraintPtrArray.size();i+=numRows,c++)
		{
			ofs[c] = rowOffset;
			int sbA = m_allConstraintPtrArray[i]->m_solverBodyIdA;
			int sbB = m_allConstraintPtrArray[i]->m_solverBodyIdB;
			btRigidBody* orgBodyA = m_tmpSolverBodyPool[sbA].m_originalBody;
			btRigidBody* orgBodyB = m_tmpSolverBodyPool[sbB].m_originalBody;

			numRows = i<m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[c].m_numConstraintRows : numContactRows ;
			if (orgBodyA)
			{
				{
					int slotA=-1;
					//find free jointNode slot for sbA
					slotA =jointNodeArray.size();
					jointNodeArray.expand();//NonInitializing();
					int prevSlot = bodyJointNodeArray[sbA];
					bodyJointNodeArray[sbA] = slotA;
					jointNodeArray[slotA].nextJointNodeIndex = prevSlot;
					jointNodeArray[slotA].jointIndex = c;
					jointNodeArray[slotA].constraintRowIndex = i;
					jointNodeArray[slotA].otherBodyIndex = orgBodyB ? sbB : -1;
				}
				for (int row=0;row<numRows;row++,cur++)
				{
					btVector3 normalInvMass =				m_allConstraintPtrArray[i+row]->m_contactNormal1 *		orgBodyA->getInvMass();
					btVector3 relPosCrossNormalInvInertia = m_allConstraintPtrArray[i+row]->m_relpos1CrossNormal *	orgBodyA->getInvInertiaTensorWorld();

					for (int r=0;r<3;r++)
					{
						J3.setElem(cur,r,m_allConstraintPtrArray[i+row]->m_contactNormal1[r]);
						J3.setElem(cur,r+4,m_allConstraintPtrArray[i+row]->m_relpos1CrossNormal[r]);
						JinvM3.setElem(cur,r,normalInvMass[r]);
						JinvM3.setElem(cur,r+4,relPosCrossNormalInvInertia[r]);
					}
					J3.setElem(cur,3,0);
					JinvM3.setElem(cur,3,0);
					J3.setElem(cur,7,0);
					JinvM3.setElem(cur,7,0);
				}
			} else
			{
				cur += numRows;
			}
			if (orgBodyB)
			{

				{
					int slotB=-1;
					//find free jointNode slot for sbA
					slotB =jointNodeArray.size();
					jointNodeArray.expand();//NonInitializing();
					int prevSlot = bodyJointNodeArray[sbB];
					bodyJointNodeArray[sbB] = slotB;
					jointNodeArray[slotB].nextJointNodeIndex = prevSlot;
					jointNodeArray[slotB].jointIndex = c;
					jointNodeArray[slotB].otherBodyIndex = orgBodyA ? sbA : -1;
					jointNodeArray[slotB].constraintRowIndex = i;
				}

				for (int row=0;row<numRows;row++,cur++)
				{
					btVector3 normalInvMassB = m_allConstraintPtrArray[i+row]->m_contactNormal2*orgBodyB->getInvMass();
					btVector3 relPosInvInertiaB = m_allConstraintPtrArray[i+row]->m_relpos2CrossNormal * orgBodyB->getInvInertiaTensorWorld();

					for (int r=0;r<3;r++)
					{
						J3.setElem(cur,r,m_allConstraintPtrArray[i+row]->m_contactNormal2[r]);
						J3.setElem(cur,r+4,m_allConstraintPtrArray[i+row]->m_relpos2CrossNormal[r]);
						JinvM3.setElem(cur,r,normalInvMassB[r]);
						JinvM3.setElem(cur,r+4,relPosInvInertiaB[r]);
					}
					J3.setElem(cur,3,0);
					JinvM3.setElem(cur,3,0);
					J3.setElem(cur,7,0);
					JinvM3.setElem(cur,7,0);
				}
			}
			else
			{
				cur += numRows;
			}
			rowOffset+=numRows;

		}
		
	}


	//compute JinvM = J*invM.
	const btScalar* JinvM = JinvM3.getBufferPointer();

	const btScalar* Jptr = J3.getBufferPointer();
	{
		BT_PROFILE("m_A.resize");
		m_A.resize(n,n);
	}
	
	{
		BT_PROFILE("m_A.setZero");
		m_A.setZero();
	}
	int c=0;
	{
		int numRows = 0;
		BT_PROFILE("Compute A");
		for (int i=0;i<m_allConstraintPtrArray.size();i+= numRows,c++)
		{
			int row__ = ofs[c];
			int sbA = m_allConstraintPtrArray[i]->m_solverBodyIdA;
			int sbB = m_allConstraintPtrArray[i]->m_solverBodyIdB;
		//	btRigidBody* orgBodyA = m_tmpSolverBodyPool[sbA].m_originalBody;
		//	btRigidBody* orgBodyB = m_tmpSolverBodyPool[sbB].m_originalBody;

			numRows = i<m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[c].m_numConstraintRows : numContactRows ;
					
			const btScalar *JinvMrow = JinvM + 2*8*(size_t)row__;

			{
				int startJointNodeA = bodyJointNodeArray[sbA];
				while (startJointNodeA>=0)
				{
					int j0 = jointNodeArray[startJointNodeA].jointIndex;
					int cr0 = jointNodeArray[startJointNodeA].constraintRowIndex;
					if (j0<c)
					{
								 
						int numRowsOther = cr0 < m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[j0].m_numConstraintRows : numContactRows;
						size_t ofsother = (m_allConstraintPtrArray[cr0]->m_solverBodyIdB == sbA) ? 8*numRowsOther  : 0;
						//printf("%d joint i %d and j0: %d: ",count++,i,j0);
						m_A.multiplyAdd2_p8r ( JinvMrow, 
						Jptr + 2*8*(size_t)ofs[j0] + ofsother, numRows, numRowsOther,  row__,ofs[j0]);
					}
					startJointNodeA = jointNodeArray[startJointNodeA].nextJointNodeIndex;
				}
			}

			{
				int startJointNodeB = bodyJointNodeArray[sbB];
				while (startJointNodeB>=0)
				{
					int j1 = jointNodeArray[startJointNodeB].jointIndex;
					int cj1 = jointNodeArray[startJointNodeB].constraintRowIndex;

					if (j1<c)
					{
						int numRowsOther =  cj1 < m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[j1].m_numConstraintRows : numContactRows;
						size_t ofsother = (m_allConstraintPtrArray[cj1]->m_solverBodyIdB == sbB) ? 8*numRowsOther  : 0;
						m_A.multiplyAdd2_p8r ( JinvMrow + 8*(size_t)numRows, 
						Jptr + 2*8*(size_t)ofs[j1] + ofsother, numRows, numRowsOther, row__,ofs[j1]);
					}
					startJointNodeB = jointNodeArray[startJointNodeB].nextJointNodeIndex;
				}
			}
		}

		{
			BT_PROFILE("compute diagonal");
			// compute diagonal blocks of m_A

			int  row__ = 0;
			int numJointRows = m_allConstraintPtrArray.size();

			int jj=0;
			for (;row__<numJointRows;)
			{

				//int sbA = m_allConstraintPtrArray[row__]->m_solverBodyIdA;
				int sbB = m_allConstraintPtrArray[row__]->m_solverBodyIdB;
			//	btRigidBody* orgBodyA = m_tmpSolverBodyPool[sbA].m_originalBody;
				btRigidBody* orgBodyB = m_tmpSolverBodyPool[sbB].m_originalBody;


				const unsigned int infom =  row__ < m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[jj].m_numConstraintRows : numContactRows;
				
				const btScalar *JinvMrow = JinvM + 2*8*(size_t)row__;
				const btScalar *Jrow = Jptr + 2*8*(size_t)row__;
				m_A.multiply2_p8r (JinvMrow, Jrow, infom, infom, row__,row__);
				if (orgBodyB) 
				{
					m_A.multiplyAdd2_p8r (JinvMrow + 8*(size_t)infom, Jrow + 8*(size_t)infom, infom, infom,  row__,row__);
				}
				row__ += infom;
				jj++;
			}
		}
	}

	if (1)
	{
		// add cfm to the diagonal of m_A
		for ( int i=0; i<m_A.rows(); ++i) 
		{
			m_A.setElem(i,i,m_A(i,i)+ m_cfm / infoGlobal.m_timeStep);
		}
	}
				   
	///fill the upper triangle of the matrix, to make it symmetric
	{
		BT_PROFILE("fill the upper triangle ");
		m_A.copyLowerToUpperTriangle();
	}

	{
		BT_PROFILE("resize/init x");
		m_x.resize(numConstraintRows);
		m_xSplit.resize(numConstraintRows);

		if (infoGlobal.m_solverMode&SOLVER_USE_WARMSTARTING)
		{
			for (int i=0;i<m_allConstraintPtrArray.size();i++)
			{
				const btSolverConstraint& c = *m_allConstraintPtrArray[i];
				m_x[i]=c.m_appliedImpulse;
				m_xSplit[i] = c.m_appliedPushImpulse;
			}
		} else
		{
			m_x.setZero();
			m_xSplit.setZero();
		}
	}

}